

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EventListControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> events;
  EventListControl *pEVar1;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pEVar1 = (EventListControl *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  events._M_extent._M_extent_value = in_RSI._M_extent_value;
  events._M_ptr = in_RDX;
  ast::EventListControl::EventListControl
            ((EventListControl *)in_RDX[1],events,*(SourceRange *)in_RSI._M_extent_value);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }